

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_test.cc
# Opt level: O0

void __thiscall DHTest_Basic_Test::TestBody(DHTest_Basic_Test *this)

{
  allocator<unsigned_char> *paVar1;
  bool bVar2;
  int iVar3;
  DH *pDVar4;
  char *pcVar5;
  uchar *puVar6;
  pointer pdVar7;
  BIGNUM *pBVar8;
  char *in_R9;
  AssertHelper local_420;
  Message local_418;
  uint local_40c;
  size_type local_408;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_3;
  Message local_3e8;
  Span<const_unsigned_char> local_3e0;
  Bytes local_3d0;
  Span<const_unsigned_char> local_3c0;
  Bytes local_3b0;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_2;
  Message local_388;
  int local_37c;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_360 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> key2;
  Message local_340;
  int local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key1;
  AssertHelper local_2e0;
  Message local_2d8;
  int local_2cc;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_298;
  Message local_290;
  int local_284;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_250;
  Message local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__7;
  UniquePtr<DH> b;
  AssertHelper local_208;
  Message local_200;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1c0;
  Message local_1b8;
  bool local_1a9;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_178;
  Message local_170;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_130;
  Message local_128;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e8;
  Message local_e0;
  int local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_b8 [4];
  int check_result;
  AssertHelper local_98;
  Message local_90;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar__1;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<DH> a;
  DHTest_Basic_Test *this_local;
  
  pDVar4 = DH_new();
  std::unique_ptr<dh_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<dh_st,bssl::internal::Deleter> *)&gtest_ar_.message_,(pointer)pDVar4);
  testing::AssertionResult::AssertionResult<std::unique_ptr<dh_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar2) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)(anon_var_dwarf_ac099 + 0xc),
               "false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
               ,0x25,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pDVar4 = (DH *)std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_84 = DH_generate_parameters_ex(pDVar4,0x40,5,(BN_GENCB *)0x0);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_80,&local_84,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar2) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_b8,(internal *)local_80,
                 (AssertionResult *)"DH_generate_parameters_ex(a.get(), 64, 5, nullptr)","false",
                 "true",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                 ,0x26,pcVar5);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)local_b8);
      testing::Message::~Message(&local_90);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pDVar4 = (DH *)std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      local_d4 = DH_check(pDVar4,(int *)((long)&gtest_ar__2.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        + 4));
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_d0,&local_d4,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar2) {
        testing::Message::Message(&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_d0,
                   (AssertionResult *)"DH_check(a.get(), &check_result)","false","true",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                   ,0x29,pcVar5);
        testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_e0);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_119 = (gtest_ar__2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_ & 1) == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_118,&local_119,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar2) {
          testing::Message::Message(&local_128);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_118,
                     (AssertionResult *)"check_result & 0x01","true","false",in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x2a,pcVar5);
          testing::internal::AssertHelper::operator=(&local_130,&local_128);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_128);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        local_161 = (gtest_ar__2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_ & 2) == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_160,&local_161,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
        if (!bVar2) {
          testing::Message::Message(&local_170);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__5.message_,(internal *)local_160,
                     (AssertionResult *)"check_result & 0x02","true","false",in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x2b,pcVar5);
          testing::internal::AssertHelper::operator=(&local_178,&local_170);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
          testing::Message::~Message(&local_170);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
        local_1a9 = (gtest_ar__2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_ & 4) == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_1a8,&local_1a9,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
        if (!bVar2) {
          testing::Message::Message(&local_1b8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__6.message_,(internal *)local_1a8,
                     (AssertionResult *)"check_result & 0x04","true","false",in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x2c,pcVar5);
          testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
          testing::internal::AssertHelper::~AssertHelper(&local_1c0);
          std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
          testing::Message::~Message(&local_1b8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
        local_1f1 = (gtest_ar__2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_ & 8) == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
        if (!bVar2) {
          testing::Message::Message(&local_200);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&b,(internal *)local_1f0,(AssertionResult *)"check_result & 0x08",
                     "true","false",in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_208,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x2d,pcVar5);
          testing::internal::AssertHelper::operator=(&local_208,&local_200);
          testing::internal::AssertHelper::~AssertHelper(&local_208);
          std::__cxx11::string::~string((string *)&b);
          testing::Message::~Message(&local_200);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
        pDVar4 = (DH *)std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
        ;
        pDVar4 = DHparams_dup(pDVar4);
        std::unique_ptr<dh_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<dh_st,bssl::internal::Deleter> *)&gtest_ar__7.message_,
                   (pointer)pDVar4);
        testing::AssertionResult::AssertionResult<std::unique_ptr<dh_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_240,
                   (unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
        if (!bVar2) {
          testing::Message::Message(&local_248);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__8.message_,(internal *)local_240,
                     (AssertionResult *)0x857b9a,"false","true",in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_250,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x30,pcVar5);
          testing::internal::AssertHelper::operator=(&local_250,&local_248);
          testing::internal::AssertHelper::~AssertHelper(&local_250);
          std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
          testing::Message::~Message(&local_248);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pDVar4 = (DH *)std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<dh_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
          local_284 = DH_generate_key(pDVar4);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_280,&local_284,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
          if (!bVar2) {
            testing::Message::Message(&local_290);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__9.message_,(internal *)local_280,
                       (AssertionResult *)"DH_generate_key(a.get())","false","true",in_R9);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_298,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                       ,0x32,pcVar5);
            testing::internal::AssertHelper::operator=(&local_298,&local_290);
            testing::internal::AssertHelper::~AssertHelper(&local_298);
            std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
            testing::Message::~Message(&local_290);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pDVar4 = (DH *)std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<dh_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__7.message_);
            local_2cc = DH_generate_key(pDVar4);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_2c8,&local_2cc,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
            if (!bVar2) {
              testing::Message::Message(&local_2d8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)
                         &key1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_2c8,
                         (AssertionResult *)"DH_generate_key(b.get())","false","true",in_R9);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_2e0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                         ,0x33,pcVar5);
              testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
              testing::internal::AssertHelper::~AssertHelper(&local_2e0);
              std::__cxx11::string::~string
                        ((string *)
                         &key1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              testing::Message::~Message(&local_2d8);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              pDVar4 = (DH *)std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<dh_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
              iVar3 = DH_size(pDVar4);
              paVar1 = (allocator<unsigned_char> *)
                       ((long)&gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       + 7);
              std::allocator<unsigned_char>::allocator(paVar1);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,(long)iVar3,
                         paVar1);
              std::allocator<unsigned_char>::~allocator
                        ((allocator<unsigned_char> *)
                         ((long)&gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7));
              puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
              pdVar7 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<dh_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__7.message_);
              pBVar8 = (BIGNUM *)DH_get0_pub_key(pdVar7);
              pDVar4 = (DH *)std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<dh_st,_bssl::internal::Deleter> *)
                                        &gtest_ar_.message_);
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_4_ = DH_compute_key(puVar6,pBVar8,pDVar4);
              local_334 = 0;
              testing::internal::CmpHelperGE<int,int>
                        ((internal *)local_330,"ret","0",(int *)&gtest_ar.message_,&local_334);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
              if (!bVar2) {
                testing::Message::Message(&local_340);
                pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)
                           &key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                           ,0x37,pcVar5);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)
                           &key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_340);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)
                           &key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                testing::Message::~Message(&local_340);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,
                           (long)(int)gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl);
                pDVar4 = (DH *)std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<dh_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__7.message_);
                iVar3 = DH_size(pDVar4);
                paVar1 = (allocator<unsigned_char> *)
                         ((long)&gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 7);
                std::allocator<unsigned_char>::allocator(paVar1);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_360,
                           (long)iVar3,paVar1);
                std::allocator<unsigned_char>::~allocator
                          ((allocator<unsigned_char> *)
                           ((long)&gtest_ar_1.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           + 7));
                puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_360);
                pdVar7 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<dh_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                pBVar8 = (BIGNUM *)DH_get0_pub_key(pdVar7);
                pDVar4 = (DH *)std::unique_ptr<dh_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<dh_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__7.message_);
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._0_4_ = DH_compute_key(puVar6,pBVar8,pDVar4);
                local_37c = 0;
                testing::internal::CmpHelperGE<int,int>
                          ((internal *)local_378,"ret","0",(int *)&gtest_ar.message_,&local_37c);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_378);
                if (!bVar2) {
                  testing::Message::Message(&local_388);
                  pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                             ,0x3c,pcVar5);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_2.message_,&local_388);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_2.message_);
                  testing::Message::~Message(&local_388);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_360,
                             (long)(int)gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl);
                  bssl::Span<unsigned_char_const>::
                  Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ((Span<unsigned_char_const> *)&local_3c0,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
                  Bytes::Bytes(&local_3b0,local_3c0);
                  bssl::Span<unsigned_char_const>::
                  Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ((Span<unsigned_char_const> *)&local_3e0,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_360);
                  Bytes::Bytes(&local_3d0,local_3e0);
                  testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                            ((EqHelper *)local_3a0,"Bytes(key1)","Bytes(key2)",&local_3b0,&local_3d0
                            );
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_3a0);
                  if (!bVar2) {
                    testing::Message::Message(&local_3e8);
                    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                               ,0x3f,pcVar5);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_3.message_,&local_3e8);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_3.message_);
                    testing::Message::~Message(&local_3e8);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
                  local_408 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &ret);
                  local_40c = 4;
                  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
                            ((internal *)local_400,"key1.size()","4u",&local_408,&local_40c);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_400);
                  if (!bVar2) {
                    testing::Message::Message(&local_418);
                    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_400)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_420,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                               ,0x45,pcVar5);
                    testing::internal::AssertHelper::operator=(&local_420,&local_418);
                    testing::internal::AssertHelper::~AssertHelper(&local_420);
                    testing::Message::~Message(&local_418);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ = 0;
                }
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_360);
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
            }
          }
        }
        std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar__7.message_);
      }
    }
  }
  std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<dh_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(DHTest, Basic) {
  bssl::UniquePtr<DH> a(DH_new());
  ASSERT_TRUE(a);
  ASSERT_TRUE(DH_generate_parameters_ex(a.get(), 64, DH_GENERATOR_5, nullptr));

  int check_result;
  ASSERT_TRUE(DH_check(a.get(), &check_result));
  EXPECT_FALSE(check_result & DH_CHECK_P_NOT_PRIME);
  EXPECT_FALSE(check_result & DH_CHECK_P_NOT_SAFE_PRIME);
  EXPECT_FALSE(check_result & DH_CHECK_UNABLE_TO_CHECK_GENERATOR);
  EXPECT_FALSE(check_result & DH_CHECK_NOT_SUITABLE_GENERATOR);

  bssl::UniquePtr<DH> b(DHparams_dup(a.get()));
  ASSERT_TRUE(b);

  ASSERT_TRUE(DH_generate_key(a.get()));
  ASSERT_TRUE(DH_generate_key(b.get()));

  std::vector<uint8_t> key1(DH_size(a.get()));
  int ret = DH_compute_key(key1.data(), DH_get0_pub_key(b.get()), a.get());
  ASSERT_GE(ret, 0);
  key1.resize(ret);

  std::vector<uint8_t> key2(DH_size(b.get()));
  ret = DH_compute_key(key2.data(), DH_get0_pub_key(a.get()), b.get());
  ASSERT_GE(ret, 0);
  key2.resize(ret);

  EXPECT_EQ(Bytes(key1), Bytes(key2));

  // |DH_compute_key|, unlike |DH_compute_key_padded|, removes leading zeros
  // from the output, so the key will not have a fixed length. This test uses a
  // small, 64-bit prime, so check for at least 32 bits of output after removing
  // leading zeros.
  EXPECT_GE(key1.size(), 4u);
}